

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::RunContext::testGroupEnded
          (RunContext *this,string *testSpec,Totals *totals,size_t groupIndex,size_t groupsCount)

{
  IStreamingReporter *pIVar1;
  pointer pcVar2;
  size_t sVar3;
  int iVar4;
  undefined1 *local_c0;
  long local_b8;
  undefined1 local_b0 [16];
  size_t local_a0;
  size_t sStack_98;
  undefined **local_90;
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  size_t local_68;
  size_t sStack_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined1 local_38;
  
  pIVar1 = (this->m_reporter).m_p;
  local_c0 = local_b0;
  pcVar2 = (testSpec->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,pcVar2,pcVar2 + testSpec->_M_string_length);
  sVar3 = (this->m_totals).assertions.failed;
  local_a0 = groupIndex;
  sStack_98 = groupsCount;
  iVar4 = (*(((this->m_config).m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[10])();
  local_90 = &PTR__TestGroupStats_001643d8;
  local_88[0] = local_78;
  std::__cxx11::string::_M_construct<char*>((string *)local_88,local_c0,local_c0 + local_b8);
  local_38 = sVar3 == (long)iVar4;
  local_68 = local_a0;
  sStack_60 = sStack_98;
  local_58 = (undefined4)(totals->assertions).passed;
  uStack_54 = *(undefined4 *)((long)&(totals->assertions).passed + 4);
  uStack_50 = (undefined4)(totals->assertions).failed;
  uStack_4c = *(undefined4 *)((long)&(totals->assertions).failed + 4);
  local_48 = (undefined4)(totals->testCases).passed;
  uStack_44 = *(undefined4 *)((long)&(totals->testCases).passed + 4);
  uStack_40 = (undefined4)(totals->testCases).failed;
  uStack_3c = *(undefined4 *)((long)&(totals->testCases).failed + 4);
  (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[0xe])(pIVar1);
  local_90 = &PTR__TestGroupStats_001643d8;
  if (local_88[0] != local_78) {
    operator_delete(local_88[0]);
  }
  if (local_c0 != local_b0) {
    operator_delete(local_c0);
  }
  return;
}

Assistant:

void testGroupEnded( std::string const& testSpec, Totals const& totals, std::size_t groupIndex, std::size_t groupsCount ) {
            m_reporter->testGroupEnded( TestGroupStats( GroupInfo( testSpec, groupIndex, groupsCount ), totals, aborting() ) );
        }